

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ImVector<unsigned_short> *this_00;
  ImDrawList *pIVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  unsigned_short *puVar4;
  ImDrawVert *pIVar5;
  ImDrawVert *pIVar6;
  long lVar7;
  int j;
  int iVar8;
  ImVector<ImDrawVert> local_58;
  ImDrawData *local_40;
  long local_38;
  
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  local_40 = this;
  for (lVar7 = 0; lVar7 < this->CmdListsCount; lVar7 = lVar7 + 1) {
    pIVar1 = this->CmdLists[lVar7];
    iVar8 = (pIVar1->IdxBuffer).Size;
    if (iVar8 != 0) {
      local_38 = lVar7;
      ImVector<ImDrawVert>::resize(&local_58,iVar8);
      this_00 = &pIVar1->IdxBuffer;
      for (iVar8 = 0; iVar8 < this_00->Size; iVar8 = iVar8 + 1) {
        puVar4 = ImVector<unsigned_short>::operator[](this_00,iVar8);
        pIVar5 = ImVector<ImDrawVert>::operator[](&pIVar1->VtxBuffer,(uint)*puVar4);
        pIVar6 = ImVector<ImDrawVert>::operator[](&local_58,iVar8);
        IVar3 = pIVar5->uv;
        pIVar6->pos = pIVar5->pos;
        pIVar6->uv = IVar3;
        pIVar6->col = pIVar5->col;
      }
      uVar2._0_4_ = (pIVar1->VtxBuffer).Size;
      uVar2._4_4_ = (pIVar1->VtxBuffer).Capacity;
      (pIVar1->VtxBuffer).Size = local_58.Size;
      (pIVar1->VtxBuffer).Capacity = local_58.Capacity;
      pIVar5 = (pIVar1->VtxBuffer).Data;
      (pIVar1->VtxBuffer).Data = local_58.Data;
      local_58._0_8_ = uVar2;
      local_58.Data = pIVar5;
      ImVector<unsigned_short>::resize(this_00,0);
      local_40->TotalVtxCount = local_40->TotalVtxCount + (pIVar1->VtxBuffer).Size;
      lVar7 = local_38;
      this = local_40;
    }
  }
  ImVector<ImDrawVert>::~ImVector(&local_58);
  return;
}

Assistant:

static inline bool CanMergeDrawCommands(ImDrawCmd* a, ImDrawCmd* b)
{
    return memcmp(&a->ClipRect, &b->ClipRect, sizeof(a->ClipRect)) == 0 && a->TextureId == b->TextureId && a->VtxOffset == b->VtxOffset && !a->UserCallback && !b->UserCallback;
}